

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

void __thiscall Spi::flash_prog(Spi *this,int addr,uint8_t *data,int n)

{
  char local_49;
  int local_2c;
  uint8_t local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  int i;
  uint8_t command [4];
  int n_local;
  uint8_t *data_local;
  int addr_local;
  Spi *this_local;
  
  i = n;
  _command = data;
  if ((this->verbose & 1U) != 0) {
    fprintf(_stdout,"prog 0x%06X +0x%03X..\n",(ulong)(uint)addr,(ulong)(uint)n);
  }
  local_28 = '\x02';
  local_27 = (undefined1)((uint)addr >> 0x10);
  local_26 = (undefined1)((uint)addr >> 8);
  local_25 = (undefined1)addr;
  flash_chip_select(this);
  send_spi(this,&local_28,4);
  send_spi(this,_command,i);
  flash_chip_deselect(this);
  if ((this->verbose & 1U) != 0) {
    for (local_2c = 0; local_2c < i; local_2c = local_2c + 1) {
      local_49 = '\n';
      if (local_2c != i + -1 && local_2c % 0x20 != 0x1f) {
        local_49 = ' ';
      }
      fprintf(_stderr,"%02x%c",(ulong)_command[local_2c],(ulong)(uint)(int)local_49);
    }
  }
  return;
}

Assistant:

void Spi::flash_prog(int addr, uint8_t *data, int n) {
	if (verbose)
		fprintf(stdout, "prog 0x%06X +0x%03X..\n", addr, n);

	uint8_t command[4] = { FC_PP, (uint8_t) (addr >> 16), (uint8_t) (addr >> 8),
			(uint8_t) addr };

	flash_chip_select();
	send_spi(command, 4);
	send_spi(data, n);
	flash_chip_deselect();

	if (verbose)
		for (int i = 0; i < n; i++)
			fprintf(stderr, "%02x%c", data[i],
					i == n - 1 || i % 32 == 31 ? '\n' : ' ');
}